

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readpsm.c
# Opt level: O1

int dumb_get_psm_subsong_count(DUMBFILE *f)

{
  int32 iVar1;
  int32 iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = dumbfile_mgetl(f);
  iVar3 = 0;
  if (iVar1 == 0x50534d20) {
    iVar1 = dumbfile_igetl(f);
    iVar2 = dumbfile_mgetl(f);
    if (iVar2 == 0x46494c45) {
      iVar5 = 0;
      if (7 < iVar1) {
        iVar5 = 0;
        do {
          iVar3 = dumbfile_error(f);
          if (iVar3 != 0) break;
          iVar2 = dumbfile_mgetl(f);
          iVar5 = iVar5 + (uint)(iVar2 == 0x534f4e47);
          iVar2 = dumbfile_igetl(f);
          dumbfile_skip(f,(long)iVar2);
          iVar1 = (iVar1 - iVar2) + -8;
        } while (7 < iVar1);
      }
      iVar4 = dumbfile_error(f);
      iVar3 = 0;
      if (iVar4 == 0) {
        iVar3 = iVar5;
      }
    }
  }
  return iVar3;
}

Assistant:

int DUMBEXPORT dumb_get_psm_subsong_count(DUMBFILE *f) {
	int length, subsongs;
	int32 l;
	
	if (dumbfile_mgetl(f) != DUMB_ID('P','S','M',' ')) return 0;

	length = dumbfile_igetl(f);

	if (dumbfile_mgetl(f) != DUMB_ID('F','I','L','E')) return 0;

	subsongs = 0;

	while (length >= 8 && !dumbfile_error(f)) {
		if (dumbfile_mgetl(f) == DUMB_ID('S','O','N','G')) subsongs++;
		l = dumbfile_igetl(f);
		dumbfile_skip(f, l);
		length -= l + 8;
	}

	if (dumbfile_error(f)) return 0;

	return subsongs;
}